

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

void __thiscall
tchecker::clock_constraints_visitor_t::add_constraints
          (clock_constraints_visitor_t *this,clock_id_t first,clock_id_t second,binary_operator_t op
          ,integer_t value)

{
  invalid_argument *this_00;
  ineq_cmp_t local_38 [4];
  ineq_cmp_t local_28;
  integer_t neg_value_1;
  integer_t local_20;
  integer_t neg_value;
  integer_t value_local;
  binary_operator_t op_local;
  clock_id_t second_local;
  clock_id_t first_local;
  clock_constraints_visitor_t *this_local;
  
  local_20 = value;
  neg_value = op;
  value_local = second;
  op_local = first;
  _second_local = this;
  switch(op) {
  case EXPR_OP_LT:
    local_38[0] = LT;
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int&,unsigned_int&,tchecker::ineq_cmp_t,int&>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               this->_c,&op_local,(uint *)&value_local,local_38,&local_20);
    break;
  case EXPR_OP_LE:
    local_38[1] = 1;
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int&,unsigned_int&,tchecker::ineq_cmp_t,int&>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               this->_c,&op_local,(uint *)&value_local,local_38 + 1,&local_20);
    break;
  case EXPR_OP_EQ:
    add_constraints(this,first,second,EXPR_OP_LE,value);
    add_constraints(this,op_local,value_local,EXPR_OP_GE,local_20);
    break;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Unexpected expression operator in clock constraint");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case EXPR_OP_GE:
    neg_value_1 = -value;
    local_28 = LE;
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int&,unsigned_int&,tchecker::ineq_cmp_t,int&>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               this->_c,(uint *)&value_local,&op_local,&local_28,&neg_value_1);
    break;
  case EXPR_OP_GT:
    local_38[3] = -value;
    local_38[2] = 0;
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int&,unsigned_int&,tchecker::ineq_cmp_t,int&>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               this->_c,(uint *)&value_local,&op_local,local_38 + 2,(int *)(local_38 + 3));
  }
  return;
}

Assistant:

void add_constraints(tchecker::clock_id_t first, tchecker::clock_id_t second, enum tchecker::binary_operator_t op,
                       tchecker::integer_t value)
  {
    switch (op) {
    case tchecker::EXPR_OP_EQ:
      add_constraints(first, second, tchecker::EXPR_OP_LE, value);
      add_constraints(first, second, tchecker::EXPR_OP_GE, value);
      break;
    case tchecker::EXPR_OP_GE: {
      tchecker::integer_t neg_value = static_cast<tchecker::integer_t>(-value);
      _c.emplace_back(second, first, tchecker::LE, neg_value);
      break;
    }
    case tchecker::EXPR_OP_GT: {
      tchecker::integer_t neg_value = static_cast<tchecker::integer_t>(-value);
      _c.emplace_back(second, first, tchecker::LT, neg_value);
      break;
    }
    case tchecker::EXPR_OP_LE:
      _c.emplace_back(first, second, tchecker::LE, value);
      break;
    case tchecker::EXPR_OP_LT:
      _c.emplace_back(first, second, tchecker::LT, value);
      break;
    default:
      throw std::invalid_argument("Unexpected expression operator in clock constraint");
    }
  }